

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O1

bool __thiscall
raft_functional_common::TestSm::isSame(TestSm *this,TestSm *with,bool check_precommit)

{
  _Rb_tree_header *p_Var1;
  buffer *pbVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  byte *pbVar7;
  byte *pbVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *__mutex_00;
  bool bVar14;
  
  if (this < with) {
    __mutex = (pthread_mutex_t *)&this->dataLock;
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) {
LAB_00161660:
      std::__throw_system_error(iVar4);
    }
    __mutex_00 = (pthread_mutex_t *)&with->dataLock;
    iVar4 = pthread_mutex_lock(__mutex_00);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
  }
  else {
    __mutex = (pthread_mutex_t *)&with->dataLock;
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) goto LAB_00161660;
    __mutex_00 = (pthread_mutex_t *)&this->dataLock;
    iVar4 = pthread_mutex_lock(__mutex_00);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
  }
  pthread_mutex_unlock(__mutex_00);
  pthread_mutex_unlock(__mutex);
  if (check_precommit) {
    if ((this->preCommits)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        (with->preCommits)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      return false;
    }
    p_Var9 = (this->preCommits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var11 = &(this->preCommits)._M_t._M_impl.super__Rb_tree_header;
    bVar14 = (_Rb_tree_header *)p_Var9 == p_Var11;
    if (!bVar14) {
      p_Var1 = &(with->preCommits)._M_t._M_impl.super__Rb_tree_header;
      do {
        p_Var12 = (with->preCommits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var1->_M_header;
        if (p_Var12 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var12 + 1) >= *(ulong *)(p_Var9 + 1)) {
              p_Var10 = p_Var12;
            }
            p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < *(ulong *)(p_Var9 + 1)];
          } while (p_Var12 != (_Base_ptr)0x0);
        }
        p_Var13 = p_Var1;
        if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
           (p_Var13 = (_Rb_tree_header *)p_Var10,
           *(ulong *)(p_Var9 + 1) < ((_Rb_tree_header *)p_Var10)->_M_node_count)) {
          p_Var13 = p_Var1;
        }
        if (p_Var13 == p_Var1) {
LAB_001614ae:
          if (!bVar14) {
            return false;
          }
          break;
        }
        p_Var12 = p_Var9[1]._M_parent;
        p_Var10 = p_Var9[1]._M_left;
        if (p_Var10 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&p_Var10->_M_parent = *(int *)&p_Var10->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&p_Var10->_M_parent = *(int *)&p_Var10->_M_parent + 1;
          }
        }
        pbVar2 = *(buffer **)(p_Var13 + 1);
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var13 + 1) + 8);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        sVar5 = nuraft::buffer::size((buffer *)p_Var12);
        sVar6 = nuraft::buffer::size(pbVar2);
        if (sVar5 != sVar6) {
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          if (p_Var10 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10);
          }
          goto LAB_001614ae;
        }
        nuraft::buffer::pos((buffer *)p_Var12,0);
        nuraft::buffer::pos(pbVar2,0);
        pbVar7 = nuraft::buffer::data((buffer *)p_Var12);
        pbVar8 = nuraft::buffer::data(pbVar2);
        sVar5 = nuraft::buffer::size((buffer *)p_Var12);
        iVar4 = bcmp(pbVar7,pbVar8,sVar5);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (p_Var10 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10);
        }
        if (iVar4 != 0) goto LAB_001614ae;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        bVar14 = (_Rb_tree_header *)p_Var9 == p_Var11;
      } while (!bVar14);
    }
  }
  if ((this->commits)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (with->commits)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    return false;
  }
  p_Var9 = (this->commits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(this->commits)._M_t._M_impl.super__Rb_tree_header;
  bVar14 = (_Rb_tree_header *)p_Var9 == p_Var11;
  if (!bVar14) {
    p_Var1 = &(with->commits)._M_t._M_impl.super__Rb_tree_header;
    while( true ) {
      p_Var12 = (with->commits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      if (p_Var12 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var12 + 1) >= *(ulong *)(p_Var9 + 1)) {
            p_Var10 = p_Var12;
          }
          p_Var12 = (&p_Var12->_M_left)[*(ulong *)(p_Var12 + 1) < *(ulong *)(p_Var9 + 1)];
        } while (p_Var12 != (_Base_ptr)0x0);
      }
      p_Var13 = p_Var1;
      if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
         (p_Var13 = (_Rb_tree_header *)p_Var10,
         *(ulong *)(p_Var9 + 1) < ((_Rb_tree_header *)p_Var10)->_M_node_count)) {
        p_Var13 = p_Var1;
      }
      if (p_Var13 == p_Var1) break;
      p_Var12 = p_Var9[1]._M_parent;
      p_Var10 = p_Var9[1]._M_left;
      if (p_Var10 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var10->_M_parent = *(int *)&p_Var10->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var10->_M_parent = *(int *)&p_Var10->_M_parent + 1;
        }
      }
      pbVar2 = *(buffer **)(p_Var13 + 1);
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(p_Var13 + 1) + 8);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      sVar5 = nuraft::buffer::size((buffer *)p_Var12);
      sVar6 = nuraft::buffer::size(pbVar2);
      if (sVar5 != sVar6) {
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (p_Var10 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10);
          return bVar14;
        }
        return bVar14;
      }
      nuraft::buffer::pos((buffer *)p_Var12,0);
      nuraft::buffer::pos(pbVar2,0);
      pbVar7 = nuraft::buffer::data((buffer *)p_Var12);
      pbVar8 = nuraft::buffer::data(pbVar2);
      sVar5 = nuraft::buffer::size((buffer *)p_Var12);
      iVar4 = bcmp(pbVar7,pbVar8,sVar5);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (p_Var10 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10);
      }
      if (iVar4 != 0) {
        return bVar14;
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      bVar14 = (_Rb_tree_header *)p_Var9 == p_Var11;
      if (bVar14) {
        return bVar14;
      }
    }
    return bVar14;
  }
  return bVar14;
}

Assistant:

bool isSame(const TestSm& with, bool check_precommit = false) {
        // NOTE:
        //   To avoid false alarm by TSAN (regarding lock order inversion),
        //   always grab lock of the smaller address one first.
        if (this < &with) {
            std::lock_guard<std::mutex> ll_mine(dataLock);
            std::lock_guard<std::mutex> ll_with(with.dataLock);
        } else {
            std::lock_guard<std::mutex> ll_with(with.dataLock);
            std::lock_guard<std::mutex> ll_mine(dataLock);
        }

        if (check_precommit) {
            if (preCommits.size() != with.preCommits.size()) return false;
            for (auto& e1: preCommits) {
                auto e2 = with.preCommits.find(e1.first);
                if (e2 == with.preCommits.end()) return false;

                ptr<buffer> e1_buf = e1.second;
                ptr<buffer> e2_buf = e2->second;
                if (e1_buf->size() != e2_buf->size()) return false;

                e1_buf->pos(0);
                e2_buf->pos(0);
                if ( memcmp( e1_buf->data(),
                             e2_buf->data(),
                             e1_buf->size() ) ) return false;
            }
        }

        if (commits.size() != with.commits.size()) return false;
        for (auto& e1: commits) {
            auto e2 = with.commits.find(e1.first);
            if (e2 == with.commits.end()) return false;

            ptr<buffer> e1_buf = e1.second;
            ptr<buffer> e2_buf = e2->second;
            if (e1_buf->size() != e2_buf->size()) return false;

            e1_buf->pos(0);
            e2_buf->pos(0);
            if ( memcmp( e1_buf->data(),
                         e2_buf->data(),
                         e1_buf->size() ) ) return false;
        }

        return true;
    }